

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# math.cpp
# Opt level: O1

bool pbrt::CatmullRomWeights(span<const_float> nodes,Float x,int *offset,span<float> weights)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  undefined1 auVar6 [16];
  ulong uVar7;
  bool bVar8;
  ulong uVar9;
  float *pfVar10;
  ulong uVar11;
  float *pfVar12;
  int iVar13;
  long lVar14;
  ulong uVar15;
  undefined1 auVar16 [16];
  float fVar17;
  Float w3;
  Float w0;
  undefined1 auVar18 [16];
  int vb;
  size_t va;
  
  uVar11 = nodes.n;
  pfVar12 = nodes.ptr;
  va = weights.n;
  pfVar10 = weights.ptr;
  vb = 4;
  if (va < 4) {
    LogFatal<char_const(&)[15],char_const(&)[2],char_const(&)[15],unsigned_long&,char_const(&)[2],int&>
              (Fatal,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/math.cpp"
               ,0x9f,"Check failed: %s >= %s with %s = %s, %s = %s",(char (*) [15])0x28127db,
               (char (*) [2])0x40a6af,(char (*) [15])0x28127db,&va,(char (*) [2])0x40a6af,&vb);
  }
  if ((x < *pfVar12) || (pfVar12[uVar11 - 1] < x)) {
    bVar8 = false;
  }
  else {
    uVar9 = uVar11 - 2;
    lVar14 = 1;
    uVar15 = uVar9;
    while (uVar7 = uVar15, 0 < (long)uVar7) {
      uVar15 = uVar7 >> 1;
      if (pfVar12[(int)uVar15 + (int)lVar14] <= x) {
        lVar14 = uVar15 + 1 + lVar14;
        uVar15 = ~uVar15 + uVar7;
      }
    }
    if (lVar14 - 1U < uVar9) {
      uVar9 = lVar14 - 1U;
    }
    uVar15 = 0;
    if (0 < lVar14) {
      uVar15 = uVar9;
    }
    iVar13 = (int)uVar15 + -1;
    *offset = iVar13;
    lVar14 = uVar15 << 0x20;
    fVar17 = *(float *)((long)pfVar12 + (lVar14 >> 0x1e));
    fVar1 = *(float *)((long)pfVar12 + (lVar14 + 0x100000000 >> 0x1e));
    fVar5 = fVar1 - fVar17;
    auVar18._0_4_ = (x - fVar17) / fVar5;
    fVar3 = auVar18._0_4_ * auVar18._0_4_;
    fVar4 = auVar18._0_4_ * fVar3;
    auVar16 = vfmsub213ss_fma(SUB6416(ZEXT464(0x40000000),0),ZEXT416((uint)fVar4),
                              ZEXT416((uint)(fVar3 * 3.0)));
    fVar2 = auVar16._0_4_ + 1.0;
    pfVar10[1] = fVar2;
    auVar6 = vfmadd231ss_fma(ZEXT416((uint)(fVar3 * 3.0)),ZEXT416((uint)fVar4),
                             SUB6416(ZEXT464(0xc0000000),0));
    pfVar10[2] = auVar6._0_4_;
    auVar16 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),ZEXT416((uint)fVar3),
                              ZEXT416((uint)fVar4));
    auVar18._0_4_ = auVar16._0_4_ + auVar18._0_4_;
    if ((int)uVar15 < 1) {
      *pfVar10 = 0.0;
      pfVar10[1] = fVar2 - auVar18._0_4_;
    }
    else {
      auVar18._0_4_ = (fVar5 * auVar18._0_4_) / (fVar1 - pfVar12[iVar13]);
      auVar18._4_12_ = SUB6012((undefined1  [60])0x0,0);
      auVar16._8_4_ = 0x80000000;
      auVar16._0_8_ = 0x8000000080000000;
      auVar16._12_4_ = 0x80000000;
      auVar16 = vxorps_avx512vl(auVar18,auVar16);
      *pfVar10 = auVar16._0_4_;
    }
    pfVar10[2] = auVar6._0_4_ + auVar18._0_4_;
    uVar9 = lVar14 + 0x200000000 >> 0x20;
    fVar4 = fVar4 - fVar3;
    if (uVar9 < uVar11) {
      fVar17 = (fVar5 * fVar4) / (pfVar12[uVar9] - fVar17);
      pfVar10[1] = pfVar10[1] - fVar17;
    }
    else {
      pfVar10[1] = pfVar10[1] - fVar4;
      pfVar10[2] = fVar4 + pfVar10[2];
      fVar17 = 0.0;
    }
    pfVar10[3] = fVar17;
    bVar8 = true;
  }
  return bVar8;
}

Assistant:

bool CatmullRomWeights(pstd::span<const Float> nodes, Float x, int *offset,
                       pstd::span<Float> weights) {
    CHECK_GE(weights.size(), 4);
    // Return _false_ if _x_ is out of bounds
    if (!(x >= nodes.front() && x <= nodes.back()))
        return false;

    // Search for the interval _idx_ containing _x_
    int idx = FindInterval(nodes.size(), [&](int i) { return nodes[i] <= x; });
    *offset = idx - 1;
    Float x0 = nodes[idx], x1 = nodes[idx + 1];

    // Compute the $t$ parameter and powers
    Float t = (x - x0) / (x1 - x0), t2 = t * t, t3 = t2 * t;

    // Compute initial node weights $w_1$ and $w_2$
    weights[1] = 2 * t3 - 3 * t2 + 1;
    weights[2] = -2 * t3 + 3 * t2;

    // Compute first node weight $w_0$
    if (idx > 0) {
        Float w0 = (t3 - 2 * t2 + t) * (x1 - x0) / (x1 - nodes[idx - 1]);
        weights[0] = -w0;
        weights[2] += w0;
    } else {
        Float w0 = t3 - 2 * t2 + t;
        weights[0] = 0;
        weights[1] -= w0;
        weights[2] += w0;
    }

    // Compute last node weight $w_3$
    if (idx + 2 < nodes.size()) {
        Float w3 = (t3 - t2) * (x1 - x0) / (nodes[idx + 2] - x0);
        weights[1] -= w3;
        weights[3] = w3;
    } else {
        Float w3 = t3 - t2;
        weights[1] -= w3;
        weights[2] += w3;
        weights[3] = 0;
    }

    return true;
}